

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsCliqueTable.cpp
# Opt level: O2

void __thiscall HighsCliqueTable::resolveSubstitution(HighsCliqueTable *this,CliqueVar *v)

{
  CliqueVar CVar1;
  long lVar2;
  
  CVar1 = *v;
  while (lVar2 = (long)(this->colsubstituted).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start[(uint)CVar1 & 0x7fffffff], lVar2 != 0) {
    CVar1 = (CliqueVar)
            ((uint)CVar1 & 0x80000000 ^
             (uint)(this->substitutions).
                   super__Vector_base<HighsCliqueTable::Substitution,_std::allocator<HighsCliqueTable::Substitution>_>
                   ._M_impl.super__Vector_impl_data._M_start[lVar2 + -1].replace ^ 0x80000000);
    *v = CVar1;
  }
  return;
}

Assistant:

void HighsCliqueTable::resolveSubstitution(CliqueVar& v) const {
  while (colsubstituted[v.col]) {
    Substitution subst = substitutions[colsubstituted[v.col] - 1];
    v = v.val == 1 ? subst.replace : subst.replace.complement();
  }
}